

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution_videos_worth_spreading.cpp
# Opt level: O3

void solve_videos_worth_spreading(void)

{
  Cache *cache;
  Video *video;
  pointer ppVar1;
  long *plVar2;
  ostream *poVar3;
  pointer ppVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (0 < num_caches) {
    lVar7 = 0;
    do {
      cache = caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      compute(cache);
      if (sorted_aggregate_videos.
          super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          sorted_aggregate_videos.
          super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar5 = 8;
        uVar6 = 0;
        ppVar1 = sorted_aggregate_videos.
                 super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar4 = sorted_aggregate_videos.
                 super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          video = *(Video **)((long)&ppVar4->first + lVar5);
          if (((mlc.super__Base_bitset<1563UL>._M_w[(ulong)(long)video->id >> 6] >>
                ((long)video->id & 0x3fU) & 1) != 0) && (video->size <= cache->remaining)) {
            Cache::add_video(cache,video);
            ppVar1 = sorted_aggregate_videos.
                     super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar4 = sorted_aggregate_videos.
                     super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar6 < (ulong)((long)ppVar1 - (long)ppVar4 >> 4));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < num_caches);
  }
  plVar2 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cerr,
                              (*caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl
                                .super__Vector_impl_data._M_start)->remaining);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void solve_videos_worth_spreading() {
    for (int cache_id = 0; cache_id < num_caches; ++cache_id) {
        Cache *cache = caches[cache_id];
        compute(cache);
        for (int i = 0; i < sorted_aggregate_videos.size(); ++i) {
            Video *video = sorted_aggregate_videos[i].second;
            if (exists(cache, video) && cache->remaining >= video->size) {
                cache->add_video(video);
            }
        }
    }

    cerr << caches[0]->remaining << endl;
    cerr << caches[0]->videos.size() << endl;
}